

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detect.c
# Opt level: O0

int openit(void)

{
  char *pcVar1;
  int local_10;
  int local_c;
  int num;
  
  local_10 = 0;
  if ((u._1052_1_ & 1) == 0) {
    do_clear_area((int)u.ux,(int)u.uy,8,openone,&local_10);
    local_c = local_10;
  }
  else {
    if (((u.ustuck)->data->mflags1 & 0x40000) != 0) {
      if (((u.uprops[0x1e].intrinsic == 0) &&
          (((ublindf == (obj *)0x0 || (ublindf->otyp == 0xed)) &&
           (((youmonst.data)->mflags1 & 0x1000) == 0)))) ||
         ((ublindf != (obj *)0x0 && (ublindf->oartifact == '\x1d')))) {
        pcVar1 = Monnam(u.ustuck);
        pline("%s opens its mouth!",pcVar1);
      }
      else {
        pline("Its mouth opens!");
      }
    }
    expels(u.ustuck,(u.ustuck)->data,'\x01');
    local_c = -1;
  }
  return local_c;
}

Assistant:

int openit(void)	/* returns number of things found and opened */
{
	int num = 0;

	if (u.uswallow) {
		if (is_animal(u.ustuck->data)) {
			if (Blind) pline("Its mouth opens!");
			else pline("%s opens its mouth!", Monnam(u.ustuck));
		}
		expels(u.ustuck, u.ustuck->data, TRUE);
		return -1;
	}

	do_clear_area(u.ux, u.uy, BOLT_LIM, openone, &num);
	return num;
}